

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maybe.hpp
# Opt level: O0

maybe<pstore::command_line::option_*,_void> * __thiscall
pstore::maybe<pstore::command_line::option_*,_void>::operator=
          (maybe<pstore::command_line::option_*,_void> *this,
          maybe<pstore::command_line::option_*,_void> *other)

{
  bool bVar1;
  option **other_00;
  maybe<pstore::command_line::option_*,_void> *other_local;
  maybe<pstore::command_line::option_*,_void> *this_local;
  
  if (other != this) {
    bVar1 = has_value(other);
    if (bVar1) {
      other_00 = value(other);
      maybe<pstore::command_line::option*,void>::operator=
                ((maybe<pstore::command_line::option*,void> *)this,other_00);
    }
    else {
      reset(this);
    }
  }
  return this;
}

Assistant:

maybe &
        operator= (maybe && other) noexcept (std::is_nothrow_move_assignable<T>::value &&
                                                 std::is_nothrow_move_constructible<T>::value) {

            if (&other != this) {
                if (!other.has_value ()) {
                    this->reset ();
                } else {
                    this->operator= (std::forward<T> (other.value ()));
                }
            }
            return *this;
        }